

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O2

void store_storefile(png_store *ps,png_uint_32 id)

{
  png_uint_32 pVar1;
  store_palette_entry *psVar2;
  undefined4 in_EAX;
  int iVar3;
  uint uVar4;
  uint uVar5;
  png_store_file *ppVar6;
  uint uVar7;
  uint uVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [16];
  
  pVar1 = pm.this.chunktype;
  auVar9._0_4_ = -(uint)(pm.this.chunklen == 0);
  auVar9._4_4_ = -(uint)(pm.this.chunktype == 0);
  auVar9._8_4_ = -(uint)(pm.this.chunkpos == 0);
  auVar10._8_4_ = 0xffffffff;
  auVar10._0_8_ = 0xffffffffffffffff;
  auVar11._0_12_ = auVar10 ^ auVar9;
  auVar11._12_4_ = -(uint)(pm.this.IDAT_size == 0);
  iVar3 = movmskps(in_EAX,auVar11);
  if (iVar3 != 0) {
    png_error(pm.this.pwrite,"storefile: incomplete write");
  }
  ppVar6 = (png_store_file *)malloc(0x270);
  if (ppVar6 != (png_store_file *)0x0) {
    safecat(ppVar6->name,0x40,0,pm.this.wname);
    ppVar6->id = (png_uint_32)ps;
    memcpy(&ppVar6->data,&pm.this.new,0x200);
    ppVar6->datacount = pm.this.writepos;
    ppVar6->IDAT_size = pVar1;
    uVar5 = pVar1 >> 0x10;
    if (0xffff >= pVar1) {
      uVar5 = pVar1;
    }
    uVar8 = (uint)(0xffff < pVar1) * 0x10;
    uVar4 = uVar5 >> 8;
    if (uVar5 < 0x100) {
      uVar4 = uVar5;
    }
    uVar7 = uVar8 + 8;
    if (uVar5 < 0x100) {
      uVar7 = uVar8;
    }
    uVar5 = uVar4 >> 4;
    if (uVar4 < 0x10) {
      uVar5 = uVar4;
    }
    uVar8 = uVar7 + 4;
    if (uVar4 < 0x10) {
      uVar8 = uVar7;
    }
    uVar4 = uVar5 >> 2;
    if (uVar5 < 4) {
      uVar4 = uVar5;
    }
    uVar7 = uVar8 + 2;
    if (uVar5 < 4) {
      uVar7 = uVar8;
    }
    uVar5 = uVar7 + 1 + (uint)((uVar4 >> 1 & 1) != 0);
    if (uVar4 == 0) {
      uVar5 = uVar7;
    }
    ppVar6->IDAT_bits = uVar5;
    iVar3 = pm.this.npalette;
    psVar2 = pm.this.palette;
    if (uVar5 != 0) {
      pm.this.new.prev = (png_store_buffer *)0x0;
      pm.this.writepos = 0;
      pm.this.chunklen = 0x10;
      pm.this.chunktype = 0;
      pm.this.chunkpos = 8;
      pm.this.IDAT_size = 0;
      pm.this.palette = (store_palette_entry *)0x0;
      ppVar6->palette = psVar2;
      pm.this.npalette = 0;
      ppVar6->npalette = iVar3;
      ppVar6->next = pm.this.saved;
      pm.this.saved = ppVar6;
      return;
    }
    png_error(pm.this.pwrite,"storefile: 0 sized IDAT");
  }
  png_error(pm.this.pwrite,"storefile: OOM");
}

Assistant:

static void
store_storefile(png_store *ps, png_uint_32 id)
{
   png_store_file *pf;

   if (ps->chunkpos != 0U || ps->chunktype != 0U || ps->chunklen != 0U ||
       ps->IDAT_size == 0)
      png_error(ps->pwrite, "storefile: incomplete write");

   pf = voidcast(png_store_file*, malloc(sizeof *pf));
   if (pf == NULL)
      png_error(ps->pwrite, "storefile: OOM");
   safecat(pf->name, sizeof pf->name, 0, ps->wname);
   pf->id = id;
   pf->data = ps->new;
   pf->datacount = ps->writepos;
   pf->IDAT_size = ps->IDAT_size;
   pf->IDAT_bits = bits_of(ps->IDAT_size);
   /* Because the IDAT always has zlib header stuff this must be true: */
   if (pf->IDAT_bits == 0U)
      png_error(ps->pwrite, "storefile: 0 sized IDAT");
   ps->new.prev = NULL;
   ps->writepos = 0;
   ps->chunkpos = 8;
   ps->chunktype = 0;
   ps->chunklen = 16;
   ps->IDAT_size = 0;
   pf->palette = ps->palette;
   pf->npalette = ps->npalette;
   ps->palette = 0;
   ps->npalette = 0;

   /* And save it. */
   pf->next = ps->saved;
   ps->saved = pf;
}